

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

bool __thiscall
sf::Shader::loadFromStream
          (Shader *this,InputStream *vertexShaderStream,InputStream *geometryShaderStream,
          InputStream *fragmentShaderStream)

{
  bool bVar1;
  ostream *poVar2;
  vector<char,_std::allocator<char>_> fragmentShader;
  vector<char,_std::allocator<char>_> geometryShader;
  vector<char,_std::allocator<char>_> vertexShader;
  char *in_stack_00001030;
  char *in_stack_00001038;
  char *in_stack_00001040;
  Shader *in_stack_00001048;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  InputStream *in_stack_ffffffffffffff20;
  vector<char,_std::allocator<char>_> local_80;
  vector<char,_std::allocator<char>_> local_68;
  undefined4 local_50;
  vector<char,_std::allocator<char>_> local_40 [2];
  bool local_1;
  
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x2c6866);
  bVar1 = anon_unknown.dwarf_3b3964::getStreamContents
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (bVar1) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x2c6908);
    bVar1 = anon_unknown.dwarf_3b3964::getStreamContents
                      (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (bVar1) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)0x2c69a4);
      bVar1 = anon_unknown.dwarf_3b3964::getStreamContents
                        (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      if (bVar1) {
        std::vector<char,_std::allocator<char>_>::operator[](local_40,0);
        std::vector<char,_std::allocator<char>_>::operator[](&local_68,0);
        std::vector<char,_std::allocator<char>_>::operator[](&local_80,0);
        in_stack_ffffffffffffff17 =
             compile(in_stack_00001048,in_stack_00001040,in_stack_00001038,in_stack_00001030);
        local_1 = (bool)in_stack_ffffffffffffff17;
      }
      else {
        poVar2 = err();
        poVar2 = std::operator<<(poVar2,"Failed to read fragment shader from stream");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        local_1 = false;
      }
      local_50 = 1;
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    }
    else {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to read geometry shader from stream");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_1 = false;
      local_50 = 1;
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  }
  else {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to read vertex shader from stream");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1 = false;
    local_50 = 1;
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  return (bool)(local_1 & 1);
}

Assistant:

bool Shader::loadFromStream(InputStream& vertexShaderStream, InputStream& geometryShaderStream, InputStream& fragmentShaderStream)
{
    // Read the vertex shader code from the stream
    std::vector<char> vertexShader;
    if (!getStreamContents(vertexShaderStream, vertexShader))
    {
        err() << "Failed to read vertex shader from stream" << std::endl;
        return false;
    }

    // Read the geometry shader code from the stream
    std::vector<char> geometryShader;
    if (!getStreamContents(geometryShaderStream, geometryShader))
    {
        err() << "Failed to read geometry shader from stream" << std::endl;
        return false;
    }

    // Read the fragment shader code from the stream
    std::vector<char> fragmentShader;
    if (!getStreamContents(fragmentShaderStream, fragmentShader))
    {
        err() << "Failed to read fragment shader from stream" << std::endl;
        return false;
    }

    // Compile the shader program
    return compile(&vertexShader[0], &geometryShader[0], &fragmentShader[0]);
}